

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O1

void __thiscall wasm::InstrumentMemory::visitStore(InstrumentMemory *this,Store *curr)

{
  Type indexType;
  ulong uVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  uint uVar4;
  Memory *pMVar5;
  Const *pCVar6;
  Expression *pEVar7;
  MixedArena *pMVar8;
  initializer_list<wasm::Expression_*> __l;
  initializer_list<wasm::Expression_*> __l_00;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_90;
  Expression *local_78;
  uintptr_t local_70;
  InstrumentMemory *local_68;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_60;
  Builder local_48;
  Builder builder;
  allocator_type local_31;
  
  this->id = this->id + 1;
  local_48.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  pMVar5 = Module::getMemory(local_48.wasm,(Name)(curr->memory).super_IString.str);
  indexType.id = (pMVar5->indexType).id;
  pCVar6 = Builder::makeConstPtr(&local_48,(curr->offset).addr,indexType);
  builder.wasm = _ZN4wasmL9store_ptrE_0;
  local_70 = _ZN4wasmL9store_ptrE_1;
  local_68 = this;
  local_90.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)Builder::makeConst<int>(&local_48,this->id);
  local_90.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)Builder::makeConst<int>(&local_48,(uint)curr->bytes);
  local_78 = curr->ptr;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_90;
  local_90.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCVar6;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_60,__l,&local_31);
  pMVar8 = &(local_48.wasm)->allocator;
  pEVar7 = (Expression *)MixedArena::allocSpace(pMVar8,0x48,8);
  pEVar7->_id = CallId;
  (pEVar7->type).id = 0;
  *(undefined8 *)(pEVar7 + 1) = 0;
  pEVar7[1].type.id = 0;
  *(undefined8 *)(pEVar7 + 2) = 0;
  pEVar7[2].type.id = (uintptr_t)pMVar8;
  *(undefined8 *)(pEVar7 + 3) = 0;
  pEVar7[3].type.id = 0;
  *(undefined1 *)&pEVar7[4]._id = InvalidId;
  (pEVar7->type).id = indexType.id;
  *(Module **)(pEVar7 + 3) = builder.wasm;
  pEVar7[3].type.id = local_70;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar7 + 1),
             &local_60);
  *(undefined1 *)&pEVar7[4]._id = InvalidId;
  curr->ptr = pEVar7;
  if (local_60.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar1 = (curr->value->type).id;
  if (uVar1 < 7) {
    uVar4 = (int)uVar1 - 2;
    if (uVar4 < 4) {
      builder.wasm = *(Module **)(&PTR_DAT_00d89000)[uVar4];
      uVar2 = *(undefined8 *)(&PTR_store_val_i32_00d88fe0)[uVar4];
      local_60.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)Builder::makeConst<int>(&local_48,local_68->id);
      local_60.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)curr->value;
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_60;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                (&local_90,__l_00,&local_31);
      uVar3 = (curr->value->type).id;
      pMVar8 = &(local_48.wasm)->allocator;
      pEVar7 = (Expression *)MixedArena::allocSpace(pMVar8,0x48,8);
      pEVar7->_id = CallId;
      (pEVar7->type).id = 0;
      *(undefined8 *)(pEVar7 + 1) = 0;
      pEVar7[1].type.id = 0;
      *(undefined8 *)(pEVar7 + 2) = 0;
      pEVar7[2].type.id = (uintptr_t)pMVar8;
      *(undefined8 *)(pEVar7 + 3) = 0;
      pEVar7[3].type.id = 0;
      *(undefined1 *)&pEVar7[4]._id = InvalidId;
      (pEVar7->type).id = uVar3;
      *(undefined8 *)(pEVar7 + 3) = uVar2;
      pEVar7[3].type.id = (uintptr_t)builder.wasm;
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar7 + 1),
                 &local_90);
      *(undefined1 *)&pEVar7[4]._id = InvalidId;
      curr->value = pEVar7;
      if ((Const *)local_90.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start != (Const *)0x0) {
        operator_delete(local_90.
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_90.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    return;
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                ,0xc6,"BasicType wasm::Type::getBasic() const");
}

Assistant:

void visitStore(Store* curr) {
    id++;
    Builder builder(*getModule());
    auto mem = getModule()->getMemory(curr->memory);
    auto indexType = mem->indexType;
    auto offset = builder.makeConstPtr(curr->offset.addr, indexType);
    curr->ptr = builder.makeCall(store_ptr,
                                 {builder.makeConst(int32_t(id)),
                                  builder.makeConst(int32_t(curr->bytes)),
                                  offset,
                                  curr->ptr},
                                 indexType);
    Name target;
    switch (curr->value->type.getBasic()) {
      case Type::i32:
        target = store_val_i32;
        break;
      case Type::i64:
        target = store_val_i64;
        break;
      case Type::f32:
        target = store_val_f32;
        break;
      case Type::f64:
        target = store_val_f64;
        break;
      default:
        return; // TODO: other types, unreachable, etc.
    }
    curr->value = builder.makeCall(
      target, {builder.makeConst(int32_t(id)), curr->value}, curr->value->type);
  }